

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_decimal128.hpp
# Opt level: O0

void __thiscall
jsoncons::bson::detail::bson_uint128_divide1B
          (detail *this,bson_uint128_t value,bson_uint128_t *quotient,uint32_t *rem)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  uint32_t *puVar5;
  undefined8 uVar6;
  int i;
  uint64_t _rem;
  uint32_t DIVISOR;
  uint32_t *rem_local;
  bson_uint128_t *quotient_local;
  bson_uint128_t value_local;
  
  puVar5 = value.parts._8_8_;
  uVar6 = value.parts._0_8_;
  value_local.parts._0_8_ = this;
  uVar2 = value_local.parts._0_8_;
  value_local.parts[2] = (uint32_t)uVar6;
  value_local.parts[3] = SUB84(uVar6,4);
  uVar3 = value_local.parts._8_8_;
  _rem = 0;
  value_local.parts[0] = (uint32_t)this;
  if ((((value_local.parts[0] == 0) &&
       (value_local.parts[1] = (uint32_t)((ulong)this >> 0x20), value_local.parts[1] == 0)) &&
      (value_local.parts[2] = value.parts[0], value_local.parts[2] == 0)) &&
     (value_local.parts[3] = value.parts[1], value_local.parts[3] == 0)) {
    *(detail **)puVar5 = this;
    *(undefined8 *)(puVar5 + 2) = uVar6;
    quotient->parts[0] = 0;
  }
  else {
    value_local.parts._0_8_ = uVar2;
    value_local.parts._8_8_ = uVar3;
    for (i = 0; i < 4; i = i + 1) {
      uVar4 = (ulong)value_local.parts[i] + (_rem << 0x20);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar4;
      value_local.parts[i] = SUB164(auVar1 / ZEXT816(1000000000),0);
      _rem = uVar4 % 1000000000;
    }
    *(undefined8 *)puVar5 = value_local.parts._0_8_;
    *(undefined8 *)(puVar5 + 2) = value_local.parts._8_8_;
    quotient->parts[0] = (uint32_t)_rem;
  }
  return;
}

Assistant:

inline
        void bson_uint128_divide1B (bson_uint128_t value,     /* IN */
                                     bson_uint128_t *quotient, /* OUT */
                                     uint32_t *rem)             /* OUT */
        {
            const uint32_t DIVISOR = 1000 * 1000 * 1000;
            uint64_t _rem = 0;
            int i = 0;
            
            if (!value.parts[0] && !value.parts[1] && !value.parts[2] &&
                !value.parts[3]) {
               *quotient = value;
               *rem = 0;
               return;
            }
            
            for (i = 0; i <= 3; i++) {
               _rem <<= 32; /* Adjust remainder to match value of next dividend */
               _rem += value.parts[i]; /* Add the divided to _rem */
               value.parts[i] = (uint32_t) (_rem / DIVISOR);
               _rem %= DIVISOR; /* Store the remainder */
            }
            
            *quotient = value;
            *rem = (uint32_t) _rem;
        }